

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat_begin_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::repeat_begin_matcher::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (repeat_begin_matcher *this,
          match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *state,matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *next)

{
  bool bVar1;
  sub_match_impl *psVar2;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  int *in_RDI;
  bool old_zero_width;
  uint old_repeat_count;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *br;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  byte bVar3;
  undefined4 uVar4;
  
  psVar2 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::sub_match(in_RSI,*in_RDI);
  uVar4 = *(undefined4 *)
           &(psVar2->
            super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).field_0x14;
  bVar1 = psVar2->zero_width_;
  bVar3 = bVar1 & 1;
  *(undefined4 *)
   &(psVar2->
    super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).field_0x14 = 1;
  psVar2->zero_width_ = false;
  bVar1 = matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
          push_match<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                    ((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(CONCAT44(uVar4,CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd0)) &
                        0xffffffff01ffffff),in_stack_ffffffffffffffc8);
  if (!bVar1) {
    *(undefined4 *)
     &(psVar2->
      super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).field_0x14 = uVar4;
    psVar2->zero_width_ = (bool)(bVar3 & 1);
  }
  return bVar1;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            sub_match_impl<BidiIter> &br = state.sub_match(this->mark_number_);

            unsigned int old_repeat_count = br.repeat_count_;
            bool old_zero_width = br.zero_width_;

            br.repeat_count_ = 1;
            br.zero_width_ = false;

            // "push" next onto the stack, so it can be "popped" in
            // repeat_end_matcher and used to loop back.
            if(next.BOOST_NESTED_TEMPLATE push_match<Next>(state))
            {
                return true;
            }

            br.repeat_count_ = old_repeat_count;
            br.zero_width_ = old_zero_width;

            return false;
        }